

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_string
          (xml_buffered_writer *this,char_t *data)

{
  ulong uVar1;
  size_t sVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  uVar1 = this->bufsize;
  cVar3 = *data;
  bVar6 = uVar1 < 0x800;
  uVar4 = uVar1;
  if (cVar3 != '\0' && bVar6) {
    do {
      uVar1 = uVar4 + 1;
      this->buffer[uVar4] = cVar3;
      cVar3 = data[1];
      data = data + 1;
      bVar6 = uVar4 < 0x7ff;
      if (cVar3 == '\0') break;
      bVar7 = uVar4 < 0x7ff;
      uVar4 = uVar1;
    } while (bVar7);
  }
  if (bVar6) {
    this->bufsize = uVar1;
    return;
  }
  uVar4 = uVar1 - this->bufsize;
  if (uVar4 < 5) {
    lVar5 = 0;
  }
  else {
    lVar5 = uVar4 - 1;
  }
  lVar5 = uVar4 - lVar5;
  this->bufsize = uVar1 - lVar5;
  sVar2 = strlen(data);
  write_direct(this,data + -lVar5,lVar5 + sVar2);
  return;
}

Assistant:

void write_string(const char_t* data)
		{
			// write the part of the string that fits in the buffer
			size_t offset = bufsize;

			while (*data && offset < bufcapacity)
				buffer[offset++] = *data++;

			// write the rest
			if (offset < bufcapacity)
			{
				bufsize = offset;
			}
			else
			{
				// backtrack a bit if we have split the codepoint
				size_t length = offset - bufsize;
				size_t extra = length - get_valid_length(data - length, length);

				bufsize = offset - extra;

				write_direct(data - extra, strlength(data) + extra);
			}
		}